

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

shared_ptr<kratos::AssignStmt> __thiscall
kratos::EnumPort::assign_(EnumPort *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  size_type sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  int iVar7;
  undefined8 *puVar8;
  long lVar9;
  VarException *pVVar10;
  InternalException *this_00;
  undefined4 in_register_00000014;
  long *plVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar12;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  string_view format_str;
  format_args args;
  IRNode *local_a8;
  long local_a0;
  undefined1 auStack_98 [8];
  shared_ptr<kratos::EnumConst> p;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  string local_58;
  allocator_type local_31;
  
  plVar11 = (long *)CONCAT44(in_register_00000014,type);
  cVar6 = (**(code **)(*(long *)*plVar11 + 0xd0))();
  if (cVar6 == '\0') {
    pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Cannot assign enum type to non enum type","");
    p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar11;
    __l._M_len = 2;
    __l._M_array = (iterator)auStack_98;
    auStack_98 = (undefined1  [8])var;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_78,__l,(allocator_type *)&local_a8);
    VarException::VarException(pVVar10,&local_58,&local_78);
    __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar9 = *plVar11;
  if (*(int *)(lVar9 + 0x168) == 3) {
    Var::as<kratos::EnumConst>((Var *)auStack_98);
    sVar1 = (((IRNode *)((long)auStack_98 + 0x270))->comment)._M_string_length;
    p_Var2 = var[0x28].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    sVar3 = *(size_t *)(sVar1 + 0x48);
    sVar4._0_4_ = p_Var2[4]._M_use_count;
    sVar4._4_4_ = p_Var2[4]._M_weak_count;
    if (sVar3 != sVar4) {
LAB_0016ac9d:
      pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Cannot assign different enum type","");
      local_a0 = *plVar11;
      __l_00._M_len = 2;
      __l_00._M_array = &local_a8;
      local_a8 = (IRNode *)var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_78,__l_00,&local_31);
      VarException::VarException(pVVar10,&local_58,&local_78);
      __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (sVar3 != 0) {
      iVar7 = bcmp(*(void **)(sVar1 + 0x40),p_Var2[4]._vptr__Sp_counted_base,sVar3);
      if (iVar7 != 0) goto LAB_0016ac9d;
    }
    if (p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  else {
    if (lVar9 == 0) {
      puVar8 = (undefined8 *)0x0;
    }
    else {
      puVar8 = (undefined8 *)
               __dynamic_cast(lVar9,&Var::typeinfo,&EnumType::typeinfo,0xfffffffffffffffe);
    }
    if (puVar8 == (undefined8 *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Unable to obtain enum definition","");
      InternalException::InternalException(this_00,&local_58);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar9 = (**(code **)*puVar8)(puVar8);
    if (lVar9 == 0) {
      pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
      (**(code **)(*(long *)*plVar11 + 0x100))(&local_78);
      auStack_98 = (undefined1  [8])
                   local_78.
                   super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_78.
           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x51;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_98;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_58,
                 (detail *)
                 "Cannot obtain enum information from var ({0}). Please use a cast if it\'s intended"
                 ,format_str,args);
      local_a8 = (IRNode *)*plVar11;
      __l_02._M_len = 1;
      __l_02._M_array = &local_a8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_98,__l_02,&local_31);
      VarException::VarException
                (pVVar10,&local_58,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_98);
      __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar9 = (**(code **)*puVar8)(puVar8);
    p_Var2 = var[0x28].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    sVar3 = *(size_t *)(lVar9 + 0x48);
    sVar5._0_4_ = p_Var2[4]._M_use_count;
    sVar5._4_4_ = p_Var2[4]._M_weak_count;
    if (sVar3 != sVar5) {
LAB_0016ad18:
      pVVar10 = (VarException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Cannot assign different enum type","");
      p.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar11;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)auStack_98;
      auStack_98 = (undefined1  [8])var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_78,__l_01,(allocator_type *)&local_a8);
      VarException::VarException(pVVar10,&local_58,&local_78);
      __cxa_throw(pVVar10,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (sVar3 != 0) {
      iVar7 = bcmp(*(void **)(lVar9 + 0x40),p_Var2[4]._vptr__Sp_counted_base,sVar3);
      if (iVar7 != 0) goto LAB_0016ad18;
    }
  }
  sVar12 = Port::assign_(&this->super_Port,var,type);
  sVar12.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar12.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> EnumPort::assign_(const std::shared_ptr<Var>& var,
                                              AssignmentType type) {
    // TODO: refactor this
    if (!var->is_enum())
        throw VarException("Cannot assign enum type to non enum type", {this, var.get()});
    if (var->type() == VarType::ConstValue) {
        auto p = var->as<EnumConst>();
        if (p->enum_def()->name != enum_type_->name)
            throw VarException("Cannot assign different enum type", {this, var.get()});
    } else {
        auto* p = dynamic_cast<EnumType*>(var.get());
        if (!p) throw InternalException("Unable to obtain enum definition");
        if (!p->enum_type())
            throw VarException(::format("Cannot obtain enum information from var ({0}). "
                                        "Please use a cast if it's intended",
                                        var->handle_name()),
                               {var.get()});
        if (p->enum_type()->name != enum_type_->name) {
            throw VarException("Cannot assign different enum type", {this, var.get()});
        }
    }
    return Port::assign_(var, type);
}